

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcPumpType::IfcPumpType(IfcPumpType *this)

{
  *(undefined ***)&this->field_0x1e0 = &PTR__Object_00816a50;
  *(undefined8 *)&this->field_0x1e8 = 0;
  *(char **)&this->field_0x1f0 = "IfcPumpType";
  Schema_2x3::IfcFlowMovingDeviceType::IfcFlowMovingDeviceType
            (&this->super_IfcFlowMovingDeviceType,&PTR_construction_vtable_24__00869870);
  *(undefined8 *)&(this->super_IfcFlowMovingDeviceType).field_0x1b8 = 0;
  *(undefined8 *)
   &(this->super_IfcFlowMovingDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject =
       0x8696f0;
  *(undefined8 *)&this->field_0x1e0 = 0x869858;
  *(undefined8 *)
   &(this->super_IfcFlowMovingDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0x88 = 0x869718;
  (this->super_IfcFlowMovingDeviceType).super_IfcDistributionFlowElementType.
  super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x869740;
  *(undefined8 *)
   &(this->super_IfcFlowMovingDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0xf0 = 0x869768;
  *(undefined8 *)
   &(this->super_IfcFlowMovingDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.field_0x148 =
       0x869790;
  *(undefined8 *)
   &(this->super_IfcFlowMovingDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x180 = 0x8697b8;
  *(undefined8 *)
   &(this->super_IfcFlowMovingDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x190 = 0x8697e0;
  *(undefined8 *)
   &(this->super_IfcFlowMovingDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.field_0x1a0 = 0x869808;
  *(undefined8 *)
   &(this->super_IfcFlowMovingDeviceType).super_IfcDistributionFlowElementType.field_0x1b0 =
       0x869830;
  *(undefined1 **)&(this->super_IfcFlowMovingDeviceType).field_0x1c0 = &this->field_0x1d0;
  *(undefined8 *)&this->field_0x1c8 = 0;
  this->field_0x1d0 = 0;
  return;
}

Assistant:

IfcPumpType() : Object("IfcPumpType") {}